

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Test<short,3,false,1u,true>
          (StorageAndSubImageTest *this)

{
  bool bVar1;
  
  PrepareFramebuffer(this,0x8d89,1);
  bVar1 = CreateTexture<short,3,false,1u,true>(this);
  if (bVar1) {
    Draw(this);
    bVar1 = Check<short,3,false,1u>(this);
    CleanTexture(this);
    CleanFramebuffer(this);
    CleanErrors(this);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StorageAndSubImageTest::Test()
{
	/* Setup. */
	PrepareFramebuffer(InternalFormat<T, S, N>(), D);

	if (!CreateTexture<T, S, N, D, I>())
	{
		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanTexture();
	CleanFramebuffer();
	CleanErrors();

	/* Pass result. */
	return result;
}